

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  byte bVar1;
  int iVar2;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *pBVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 _index [16];
  bool bVar7;
  char cVar8;
  int iVar9;
  logic_error *this_00;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  char cVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  float fVar27;
  float fVar28;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar7 = has_next(this,all_cofacets);
  if (bVar7) {
    pBVar3 = this->simplex_encoding;
    iVar14 = this->j;
    bVar1 = this->k;
    uVar20 = (ulong)this->idx_below;
    uVar19 = *(ulong *)((long)&this->idx_below + 8);
    lVar24 = *(long *)((long)&this->idx_above + 8);
    uVar25 = (ulong)this->idx_above;
    cVar22 = bVar1 + 1;
    lVar18 = (long)iVar14 * -4;
    lVar23 = 0;
    while( true ) {
      iVar6 = (int)lVar23;
      iVar15 = iVar14 + iVar6;
      cVar8 = (char)((ulong)bVar1 + lVar23);
      if (cVar8 == '\0') {
        uVar21 = 0;
        uVar16 = 1;
      }
      else {
        uVar16 = (ulong)iVar15;
        uVar12 = ((uint)bVar1 + iVar6 + -1) * pBVar3->bits_per_vertex;
        bVar10 = (byte)uVar12;
        bVar11 = bVar10 & 0x3f;
        uVar17 = uVar16 << (bVar10 & 0x3f);
        bVar7 = (uVar12 & 0x40) != 0;
        uVar21 = ((long)uVar16 >> 0x3f) << bVar11 | uVar16 >> 0x40 - bVar11;
        if (bVar7) {
          uVar21 = uVar17;
        }
        uVar16 = 0;
        if (!bVar7) {
          uVar16 = uVar17;
        }
      }
      iVar9 = (int)((ulong)bVar1 + lVar23);
      if (uVar19 < uVar21 || uVar19 - uVar21 < (ulong)(uVar20 < uVar16)) break;
      if (cVar8 == '\0') {
        uVar21 = 0;
        uVar16 = 1;
      }
      else {
        uVar16 = (ulong)iVar15;
        uVar12 = ((uint)bVar1 + iVar6 + -1) * pBVar3->bits_per_vertex;
        bVar10 = (byte)uVar12;
        bVar11 = bVar10 & 0x3f;
        uVar17 = uVar16 << (bVar10 & 0x3f);
        bVar7 = (uVar12 & 0x40) != 0;
        uVar21 = ((long)uVar16 >> 0x3f) << bVar11 | uVar16 >> 0x40 - bVar11;
        if (bVar7) {
          uVar21 = uVar17;
        }
        uVar16 = 0;
        if (!bVar7) {
          uVar16 = uVar17;
        }
      }
      bVar7 = uVar20 < uVar16;
      uVar20 = uVar20 - uVar16;
      uVar19 = (uVar19 - uVar21) - (ulong)bVar7;
      *(ulong *)&this->idx_below = uVar20;
      *(ulong *)((long)&this->idx_below + 8) = uVar19;
      bVar7 = cVar22 == '\0';
      cVar22 = cVar22 + -1;
      if (bVar7) {
        uVar16 = 0;
        uVar17 = 1;
      }
      else {
        uVar16 = (ulong)iVar15;
        uVar12 = iVar9 * pBVar3->bits_per_vertex;
        bVar10 = (byte)uVar12;
        bVar11 = bVar10 & 0x3f;
        uVar21 = uVar16 << (bVar10 & 0x3f);
        bVar7 = (uVar12 & 0x40) != 0;
        uVar16 = ((long)uVar16 >> 0x3f) << bVar11 | uVar16 >> 0x40 - bVar11;
        if (bVar7) {
          uVar16 = uVar21;
        }
        uVar17 = 0;
        if (!bVar7) {
          uVar17 = uVar21;
        }
      }
      bVar7 = CARRY8(uVar25,uVar17);
      uVar25 = uVar25 + uVar17;
      lVar24 = lVar24 + uVar16 + (ulong)bVar7;
      *(ulong *)&this->idx_above = uVar25;
      *(long *)((long)&this->idx_above + 8) = lVar24;
      this->j = iVar14 + -1 + iVar6;
      this->k = bVar1 + (char)lVar23 + -1;
      lVar23 = lVar23 + -1;
      lVar18 = lVar18 + 4;
      if (cVar22 == '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    fVar27 = (this->simplex).
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
             .first;
    piVar13 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar13 != piVar4) {
      do {
        iVar2 = *piVar13;
        if (iVar15 == iVar2) {
          fVar28 = 0.0;
        }
        else {
          if (iVar15 < iVar2) {
            pfVar26 = (float *)((long)(this->dist->rows).
                                      super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar2] - lVar18);
          }
          else {
            pfVar26 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar14 + lVar23] + iVar2;
          }
          fVar28 = *pfVar26;
        }
        if (fVar28 <= fVar27) {
          fVar28 = fVar27;
        }
        fVar27 = fVar28;
        piVar13 = piVar13 + 1;
      } while (piVar13 != piVar4);
    }
    uVar25 = (ulong)this->idx_above;
    uVar5 = *(undefined8 *)((long)&this->idx_above + 8);
    this->j = iVar14 + iVar6 + -1;
    if (cVar22 == '\0') {
      iVar14 = 0;
      uVar16 = 1;
    }
    else {
      uVar16 = (ulong)iVar15;
      uVar12 = pBVar3->bits_per_vertex * iVar9;
      bVar11 = (byte)uVar12;
      bVar1 = bVar11 & 0x3f;
      uVar21 = uVar16 << (bVar11 & 0x3f);
      bVar7 = (uVar12 & 0x40) != 0;
      uVar16 = ((long)uVar16 >> 0x3f) << bVar1 | uVar16 >> 0x40 - bVar1;
      if (bVar7) {
        uVar16 = uVar21;
      }
      iVar14 = (int)uVar16;
      uVar16 = 0;
      if (!bVar7) {
        uVar16 = uVar21;
      }
    }
    uVar21 = uVar25 + uVar20;
    _index._8_4_ = fVar27;
    _index._0_8_ = in_stack_ffffffffffffff88;
    _index._12_4_ = 0;
    entry_with_coeff_t::entry_with_coeff_t
              ((entry_with_coeff_t *)&local_48,(simplex_t)_index,(int)uVar21 + (int)uVar16,
               iVar14 + (int)uVar5 + (int)uVar19 + (uint)CARRY8(uVar25,uVar20) +
                        (uint)CARRY8(uVar21,uVar16));
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
    .first = fVar27;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x10) = local_48;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x18) = uStack_40;
    bVar7 = true;
  }
  else {
    bVar7 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar7;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }